

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O3

cmSourceFileLocation * __thiscall
cmSourceFileLocation::operator=(cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  if (this != loc) {
    this->Makefile = loc->Makefile;
    this->AmbiguousDirectory = loc->AmbiguousDirectory;
    this->AmbiguousExtension = loc->AmbiguousExtension;
    std::__cxx11::string::_M_assign((string *)&this->Directory);
    std::__cxx11::string::_M_assign((string *)&this->Name);
    UpdateExtension(this,&this->Name);
  }
  return this;
}

Assistant:

cmSourceFileLocation& cmSourceFileLocation::operator=(
  const cmSourceFileLocation& loc)
{
  if (this == &loc) {
    return *this;
  }
  this->Makefile = loc.Makefile;
  this->AmbiguousDirectory = loc.AmbiguousDirectory;
  this->AmbiguousExtension = loc.AmbiguousExtension;
  this->Directory = loc.Directory;
  this->Name = loc.Name;
  this->UpdateExtension(this->Name);
  return *this;
}